

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

type __thiscall
chrono::ChClassRegistration<chrono::ChConstraintNgeneric>::_create<chrono::ChConstraintNgeneric>
          (ChClassRegistration<chrono::ChConstraintNgeneric> *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)::operator_new(0x90);
  *(undefined4 *)(puVar1 + 5) = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined1 *)((long)puVar1 + 0x2c) = 1;
  *(undefined4 *)(puVar1 + 6) = 1;
  puVar1[7] = 0;
  *puVar1 = &PTR__ChConstraintNgeneric_01187440;
  puVar1[0x11] = 0;
  *(undefined1 (*) [64])(puVar1 + 9) = ZEXT464(0) << 0x40;
  return puVar1;
}

Assistant:

typename enable_if< std::is_default_constructible<Tc>::value, void* >::type
    _create() {
        return reinterpret_cast<void*>(new Tc);
    }